

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QString * __thiscall QXmlStreamReader::errorString(QXmlStreamReader *this)

{
  QXmlStreamReaderPrivate *pQVar1;
  QString *in_RDI;
  QXmlStreamReaderPrivate *d;
  QString *this_00;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QXmlStreamReader *)0x64a888);
  if (pQVar1->type == Invalid) {
    QString::QString(this_00,in_RDI);
  }
  else {
    QString::QString((QString *)0x64a8bb);
  }
  return this_00;
}

Assistant:

QString QXmlStreamReader::errorString() const
{
    Q_D(const QXmlStreamReader);
    if (d->type == QXmlStreamReader::Invalid)
        return d->errorString;
    return QString();
}